

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool fs_create_directory_with_parents(string *path)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ulong in_RDI;
  int ret;
  stat info_1;
  string subpath;
  size_t pos_slash;
  stat info;
  stat local_158;
  string local_c8 [32];
  long local_a8;
  stat local_a0;
  ulong local_10;
  byte local_1;
  
  local_10 = in_RDI;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = stat(pcVar3,&local_a0);
  if (iVar2 == 0) {
    local_1 = (local_a0.st_mode & 0xf000) == 0x4000;
  }
  else {
    local_a8 = 1;
    do {
      local_a8 = std::__cxx11::string::find((char)local_10,0x2f);
      if (local_a8 == -1) {
        local_1 = 1;
        break;
      }
      std::__cxx11::string::substr((ulong)local_c8,local_10);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar2 = stat(pcVar3,&local_158);
      if (iVar2 == 0) {
        if ((local_158.st_mode & 0xf000) == 0x4000) {
LAB_001667f8:
          local_a8 = local_a8 + 1;
          bVar1 = false;
        }
        else {
          local_1 = 0;
          bVar1 = true;
        }
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::c_str();
        iVar2 = mkdir(pcVar3,0x1ed);
        if (iVar2 == 0) goto LAB_001667f8;
        local_1 = 0;
        bVar1 = true;
      }
      std::__cxx11::string::~string(local_c8);
    } while (!bVar1);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool fs_create_directory_with_parents(const std::string & path) {
#ifdef _WIN32
    std::wstring_convert<std::codecvt_utf8<wchar_t>> converter;
    std::wstring wpath = converter.from_bytes(path);

    // if the path already exists, check whether it's a directory
    const DWORD attributes = GetFileAttributesW(wpath.c_str());
    if ((attributes != INVALID_FILE_ATTRIBUTES) && (attributes & FILE_ATTRIBUTE_DIRECTORY)) {
        return true;
    }

    size_t pos_slash = 0;

    // process path from front to back, procedurally creating directories
    while ((pos_slash = path.find('\\', pos_slash)) != std::string::npos) {
        const std::wstring subpath = wpath.substr(0, pos_slash);
        const wchar_t * test = subpath.c_str();

        const bool success = CreateDirectoryW(test, NULL);
        if (!success) {
            const DWORD error = GetLastError();

            // if the path already exists, ensure that it's a directory
            if (error == ERROR_ALREADY_EXISTS) {
                const DWORD attributes = GetFileAttributesW(subpath.c_str());
                if (attributes == INVALID_FILE_ATTRIBUTES || !(attributes & FILE_ATTRIBUTE_DIRECTORY)) {
                    return false;
                }
            } else {
                return false;
            }
        }

        pos_slash += 1;
    }

    return true;
#else
    // if the path already exists, check whether it's a directory
    struct stat info;
    if (stat(path.c_str(), &info) == 0) {
        return S_ISDIR(info.st_mode);
    }

    size_t pos_slash = 1; // skip leading slashes for directory creation

    // process path from front to back, procedurally creating directories
    while ((pos_slash = path.find('/', pos_slash)) != std::string::npos) {
        const std::string subpath = path.substr(0, pos_slash);
        struct stat info;

        // if the path already exists, ensure that it's a directory
        if (stat(subpath.c_str(), &info) == 0) {
            if (!S_ISDIR(info.st_mode)) {
                return false;
            }
        } else {
            // create parent directories
            const int ret = mkdir(subpath.c_str(), 0755);
            if (ret != 0) {
                return false;
            }
        }

        pos_slash += 1;
    }

    return true;
#endif // _WIN32
}